

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVLABase<QString>::resize_impl
          (QVLABase<QString> *this,qsizetype prealloc,void *array,qsizetype sz,QString *v)

{
  QString *pQVar1;
  void *pvVar2;
  Data *pDVar3;
  long lVar4;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QString *)(this->super_QVLABaseBase).ptr;
  if ((v < pQVar1) || (pQVar1 + (this->super_QVLABaseBase).s <= v)) {
    lVar4 = (this->super_QVLABaseBase).a;
    if (lVar4 <= sz) {
      lVar4 = sz;
    }
    reallocate_impl(this,prealloc,array,sz,lVar4);
    lVar4 = (this->super_QVLABaseBase).s;
    while (lVar4 < sz) {
      pvVar2 = (this->super_QVLABaseBase).ptr;
      pDVar3 = (v->d).d;
      *(Data **)((long)pvVar2 + lVar4 * 0x18) = pDVar3;
      *(char16_t **)((long)pvVar2 + lVar4 * 0x18 + 8) = (v->d).ptr;
      *(qsizetype *)((long)pvVar2 + lVar4 * 0x18 + 0x10) = (v->d).size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar4 = (this->super_QVLABaseBase).s + 1;
      (this->super_QVLABaseBase).s = lVar4;
    }
  }
  else {
    local_38.d.d = (v->d).d;
    local_38.d.ptr = (v->d).ptr;
    local_38.d.size = (v->d).size;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    resize_impl(this,prealloc,array,sz,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz, const T &v)
    {
        if (QtPrivate::q_points_into_range(&v, begin(), end())) {
            resize_impl(prealloc, array, sz, T(v));
            return;
        }
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        while (size() < sz) {
            q20::construct_at(data() + size(), v);
            ++s;
        }
    }